

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall
google::protobuf::DynamicMessageFactory::DynamicMessageFactory
          (DynamicMessageFactory *this,DescriptorPool *pool)

{
  _Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  allocator_type local_23;
  key_equal local_22;
  hash<const_google::protobuf::Descriptor_*> local_21;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_0070c900;
  this->pool_ = pool;
  this->delegate_to_generated_factory_ = false;
  this_00 = (_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)operator_new(0x38);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(this_00,0,&local_21,&local_22,&local_23);
  (this->prototypes_).ptr_ = (PrototypeMap *)this_00;
  internal::Mutex::Mutex(&this->prototypes_mutex_);
  return;
}

Assistant:

DynamicMessageFactory::DynamicMessageFactory(const DescriptorPool* pool)
  : pool_(pool), delegate_to_generated_factory_(false),
    prototypes_(new PrototypeMap) {
}